

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_blech32.c
# Opt level: O0

_Bool check_confidential_addr_to_addr_segwit_script(void)

{
  int iVar1;
  _Bool is_success;
  char *pcStack_18;
  int ret;
  char *bech32;
  
  pcStack_18 = (char *)0x0;
  iVar1 = wally_confidential_addr_to_addr_segwit
                    (elements_script_blech32,"el","ert",&stack0xffffffffffffffe8);
  if (iVar1 == 0) {
    iVar1 = strcmp(pcStack_18,elements_script_bech32);
    wally_free_string(pcStack_18);
    bech32._7_1_ = iVar1 == 0;
  }
  else {
    bech32._7_1_ = false;
  }
  return bech32._7_1_;
}

Assistant:

static bool check_confidential_addr_to_addr_segwit_script(void)
{
    char *bech32 = NULL;
    int ret;
    bool is_success = false;

    ret = wally_confidential_addr_to_addr_segwit(elements_script_blech32,
                                                 "el", "ert", &bech32);
    if (ret != WALLY_OK)
        return false;

    if (strcmp(bech32, elements_script_bech32) == 0)
        is_success = true;

    wally_free_string(bech32);
    return is_success;
}